

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int unpack(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  int size;
  int local_28;
  uint n;
  int e;
  int i;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  lVar2 = luaL_optinteger(L,2,1);
  n = (uint)lVar2;
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    local_28 = luaL_len(L,1);
  }
  else {
    lVar2 = luaL_checkinteger(L,3);
    local_28 = (int)lVar2;
  }
  if (local_28 < (int)n) {
    L_local._4_4_ = 0;
  }
  else {
    if (local_28 - n < 0x7ffffff6) {
      size = (local_28 - n) + 1;
      iVar1 = lua_checkstack(L,size);
      if (iVar1 != 0) {
        lua_rawgeti(L,1,n);
        while ((int)n < local_28) {
          lua_rawgeti(L,1,n + 1);
          n = n + 1;
        }
        return size;
      }
    }
    L_local._4_4_ = luaL_error(L,"too many results to unpack");
  }
  return L_local._4_4_;
}

Assistant:

static int unpack (lua_State *L) {
  int i, e;
  unsigned int n;
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 2, 1);
  e = luaL_opt(L, luaL_checkint, 3, luaL_len(L, 1));
  if (i > e) return 0;  /* empty range */
  n = (unsigned int)e - (unsigned int)i;  /* number of elements minus 1 */
  if (n > (INT_MAX - 10) || !lua_checkstack(L, ++n))
    return luaL_error(L, "too many results to unpack");
  lua_rawgeti(L, 1, i);  /* push arg[i] (avoiding overflow problems) */
  while (i++ < e)  /* push arg[i + 1...e] */
    lua_rawgeti(L, 1, i);
  return n;
}